

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_demo.cpp
# Opt level: O2

void __thiscall despot::RegDemo::PrintMDPPolicy(RegDemo *this)

{
  int iVar1;
  ostream *poVar2;
  int s;
  long lVar3;
  long lVar4;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"MDP (Start)");
  std::endl<char,std::char_traits<char>>(poVar2);
  lVar4 = 0;
  lVar3 = 0;
  while( true ) {
    iVar1 = (**(code **)(*(long *)this + 0xd0))(this);
    if (iVar1 <= lVar3) break;
    poVar2 = std::operator<<((ostream *)&std::cout,"State ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(int)lVar3);
    poVar2 = std::operator<<(poVar2,"; Action = ");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)poVar2,*(int *)(*(long *)&this->field_0x10 + lVar4));
    std::operator<<(poVar2,"; Reward = ");
    poVar2 = std::ostream::_M_insert<double>(*(double *)(*(long *)&this->field_0x10 + 8 + lVar4));
    std::endl<char,std::char_traits<char>>(poVar2);
    (**(code **)(*(long *)this + 0x88))
              (this,(this->states_).
                    super__Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar3],&std::cout);
    lVar3 = lVar3 + 1;
    lVar4 = lVar4 + 0x10;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"MDP (End)");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void RegDemo::PrintMDPPolicy() const {
	cout << "MDP (Start)" << endl;
	for (int s = 0; s < NumStates(); s++) {
		cout << "State " << s << "; Action = " << policy_[s].action
			<< "; Reward = " << policy_[s].value << endl;
		PrintState(*(states_[s]));
	}
	cout << "MDP (End)" << endl;
}